

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_7,_8>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  undefined4 uVar7;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Type in1;
  Type in0;
  Vec4 *local_d0;
  undefined8 local_c8;
  float local_c0 [6];
  Matrix<float,_2,_3> local_a8;
  float local_8c [6];
  float local_74 [3];
  Matrix<float,_4,_2> local_68;
  Matrix<float,_4,_3> local_40;
  
  pfVar1 = (float *)&local_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar7;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 == 0x10);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_68.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_68.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_68.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_68.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    local_68.m_data.m_data[1].m_data[0] = 0.0;
    local_68.m_data.m_data[1].m_data[1] = 0.0;
    local_68.m_data.m_data[1].m_data[2] = 0.0;
    local_68.m_data.m_data[1].m_data[3] = 0.0;
    local_68.m_data.m_data[0].m_data[0] = 0.0;
    local_68.m_data.m_data[0].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[2] = 0.0;
    local_68.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &s_constInMat2x4;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = *(float *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 == 4);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 2;
    } while (lVar2 != 4);
  }
  pfVar1 = (float *)&local_a8;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar2 != lVar4) {
          uVar7 = 0;
        }
        pfVar1[lVar4 * 2] = (float)uVar7;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      pfVar1 = pfVar1 + 1;
      bVar6 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar6);
    local_a8.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_a8.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_a8.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    local_a8.m_data.m_data[0].m_data[0] = 0.0;
    local_a8.m_data.m_data[0].m_data[1] = 0.0;
    local_a8.m_data.m_data[1].m_data[0] = 0.0;
    local_a8.m_data.m_data[1].m_data[1] = 0.0;
    local_a8.m_data.m_data[2].m_data[0] = 0.0;
    local_a8.m_data.m_data[2].m_data[1] = 0.0;
    puVar3 = &DAT_01c2e148;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4 * 2] = (float)puVar3[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 3;
      bVar6 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar6);
  }
  tcu::operator*(&local_40,&local_68,&local_a8);
  local_74[0] = local_40.m_data.m_data[0].m_data[0];
  local_74[1] = local_40.m_data.m_data[0].m_data[1];
  local_74[2] = local_40.m_data.m_data[0].m_data[2];
  local_8c[3] = local_40.m_data.m_data[1].m_data[1];
  local_8c[4] = local_40.m_data.m_data[1].m_data[2];
  local_8c[5] = local_40.m_data.m_data[1].m_data[3];
  local_d0 = (Vec4 *)0x0;
  local_c8 = (ulong)local_c8._4_4_ << 0x20;
  lVar2 = 0;
  do {
    *(float *)((long)&local_d0 + lVar2 * 4) = local_8c[lVar2 + 6] + local_8c[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_8c[0] = local_40.m_data.m_data[2].m_data[2];
  local_8c[1] = local_40.m_data.m_data[2].m_data[3];
  local_8c[2] = local_40.m_data.m_data[2].m_data[0];
  local_c0[2] = 0.0;
  local_c0[3] = 0.0;
  local_c0[4] = 0.0;
  lVar2 = 0;
  do {
    local_c0[lVar2 + 2] = *(float *)((long)&local_d0 + lVar2 * 4) + local_8c[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_d0 = &evalCtx->color;
  local_c8 = 0x100000000;
  local_c0[0] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_d0 + lVar2 * 4)] = local_c0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}